

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_fp.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  long in_RSI;
  int in_EDI;
  double dVar3;
  long netf;
  long ncfn;
  long nni;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  int iout;
  sunrealtype tout;
  sunrealtype t;
  FILE *UFID;
  void *arkode_mem;
  SUNNonlinearSolver NLS;
  N_Vector y;
  int flag;
  char *info_fname;
  SUNLogger logger;
  SUNContext ctx;
  int monitor;
  sunrealtype rdata [3];
  sunrealtype w0;
  sunrealtype v0;
  sunrealtype u0;
  sunrealtype ep;
  sunrealtype b;
  sunrealtype a;
  int maxcor;
  int fp_m;
  sunrealtype abstol;
  sunrealtype reltol;
  int test;
  int Nt;
  sunindextype NEQ;
  sunrealtype dTout;
  sunrealtype Tf;
  sunrealtype T0;
  double in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  void *in_stack_fffffffffffffed8;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  int local_f4;
  double local_f0;
  double local_e8;
  FILE *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  long *local_c8;
  int local_bc;
  char *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  int local_9c;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 local_40;
  int local_38;
  int local_34;
  undefined8 local_30;
  double local_28;
  double local_20;
  double local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_18 = 0.0;
  local_20 = 10.0;
  local_28 = 1.0;
  local_30 = 3;
  local_10 = in_RSI;
  local_8 = in_EDI;
  dVar3 = ceil(10.0);
  local_34 = (int)dVar3;
  local_38 = 3;
  local_40 = 0x3eb0c6f7a0b5ed8d;
  local_48 = 0x3ddb7cdfd9d7bdbb;
  local_4c = 3;
  local_50 = 10;
  local_9c = 0;
  local_a8 = 0;
  local_b0 = 0;
  local_b8 = "ark_brusselator_fp-info.txt";
  local_c8 = (long *)0x0;
  local_d0 = 0;
  local_d8 = 0;
  if (local_8 == 2) {
    local_9c = atoi(*(char **)(local_10 + 8));
  }
  local_bc = SUNContext_Create(0,&local_a8);
  iVar2 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
  if (iVar1 == 0) {
    local_bc = SUNLogger_Create(0,0,&local_b0);
    iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
    if (iVar1 == 0) {
      if (local_9c != 0) {
        local_bc = SUNLogger_SetInfoFilename(local_b0,local_b8);
        iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
        if (iVar1 != 0) {
          return 1;
        }
      }
      local_bc = SUNContext_SetLogger(local_a8,local_b0);
      iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
      if (iVar1 == 0) {
        if (local_38 == 1) {
          local_70 = 0x400f333333333333;
          local_78 = 0x3ff199999999999a;
          local_80 = 0x4006666666666666;
          local_58 = 0x3ff3333333333333;
          local_60 = 0x4004000000000000;
          local_68 = 0x3ee4f8b588e368f1;
        }
        else if (local_38 == 3) {
          local_70 = 0x4008000000000000;
          local_78 = 0x4008000000000000;
          local_80 = 0x400c000000000000;
          local_58 = 0x3fe0000000000000;
          local_60 = 0x4008000000000000;
          local_68 = 0x3f40624dd2f1a9fc;
        }
        else {
          local_70 = 0x3ff3333333333333;
          local_78 = 0x4008cccccccccccd;
          local_80 = 0x4008000000000000;
          local_58 = 0x3ff0000000000000;
          local_60 = 0x400c000000000000;
          local_68 = 0x3ed4f8b588e368f1;
        }
        printf("\nBrusselator ODE test problem, fixed-point solver:\n");
        printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",local_70,local_78,local_80);
        printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",local_58,local_60,local_68);
        printf("    reltol = %.1e,  abstol = %.1e\n\n",local_40,local_48);
        local_98 = local_58;
        local_90 = local_60;
        local_88 = local_68;
        local_c8 = (long *)N_VNew_Serial(local_30,local_a8);
        iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
        if (iVar1 == 0) {
          **(undefined8 **)(*local_c8 + 0x10) = local_70;
          *(undefined8 *)(*(long *)(*local_c8 + 0x10) + 8) = local_78;
          *(undefined8 *)(*(long *)(*local_c8 + 0x10) + 0x10) = local_80;
          local_d8 = ARKStepCreate(local_18,fe,fi,local_c8,local_a8);
          iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
          if (iVar1 == 0) {
            local_d0 = SUNNonlinSol_FixedPoint(local_c8,local_4c,local_a8);
            iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
            if (iVar1 == 0) {
              local_bc = ARKodeSetNonlinearSolver(local_d8,local_d0);
              iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
              if (iVar1 == 0) {
                local_bc = ARKodeSetUserData(local_d8,&local_98);
                iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
                if (iVar1 == 0) {
                  local_bc = ARKodeSStolerances(local_40,local_48,local_d8);
                  iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
                  if (iVar1 == 0) {
                    local_bc = ARKodeSetMaxNonlinIters(local_d8,local_50);
                    iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
                    if (iVar1 == 0) {
                      local_bc = ARKodeSetAutonomous(local_d8,1);
                      iVar1 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar2);
                      if (iVar1 == 0) {
                        local_e0 = fopen("solution.txt","w");
                        fprintf(local_e0,"# t u v w\n");
                        fprintf(local_e0," %.16e %.16e %.16e %.16e\n",local_18,
                                **(undefined8 **)(*local_c8 + 0x10),
                                *(undefined8 *)(*(long *)(*local_c8 + 0x10) + 8),
                                *(undefined8 *)(*(long *)(*local_c8 + 0x10) + 0x10));
                        local_e8 = local_18;
                        local_f0 = local_18 + local_28;
                        printf("        t           u           v           w\n");
                        printf("   ----------------------------------------------\n");
                        for (local_f4 = 0; iVar1 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                            local_f4 < local_34; local_f4 = local_f4 + 1) {
                          local_bc = ARKodeEvolve(local_f0,local_d8,local_c8,&local_e8,1);
                          iVar2 = check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                             iVar1);
                          if (iVar2 != 0) break;
                          printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",local_e8,
                                 **(undefined8 **)(*local_c8 + 0x10),
                                 *(undefined8 *)(*(long *)(*local_c8 + 0x10) + 8),
                                 *(undefined8 *)(*(long *)(*local_c8 + 0x10) + 0x10));
                          fprintf(local_e0," %.16e %.16e %.16e %.16e\n",local_e8,
                                  **(undefined8 **)(*local_c8 + 0x10),
                                  *(undefined8 *)(*(long *)(*local_c8 + 0x10) + 8),
                                  *(undefined8 *)(*(long *)(*local_c8 + 0x10) + 0x10));
                          if (local_bc < 0) {
                            fprintf(_stderr,"Solver failure, stopping integration\n");
                            break;
                          }
                          in_stack_fffffffffffffec8 = local_28 + local_f0;
                          if (local_20 < in_stack_fffffffffffffec8) {
                            in_stack_fffffffffffffec8 = local_20;
                          }
                          local_f0 = in_stack_fffffffffffffec8;
                        }
                        printf("   ----------------------------------------------\n");
                        fclose(local_e0);
                        local_bc = ARKodeGetNumSteps(local_d8,&local_100);
                        check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar1);
                        local_bc = ARKodeGetNumStepAttempts(local_d8,&local_108);
                        check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar1);
                        local_bc = ARKodeGetNumRhsEvals(local_d8,0,&local_110);
                        check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar1);
                        local_bc = ARKodeGetNumRhsEvals(local_d8,1,&local_118);
                        check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar1);
                        local_bc = ARKodeGetNumErrTestFails(local_d8,&stack0xfffffffffffffed0);
                        check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar1);
                        local_bc = ARKodeGetNumNonlinSolvIters(local_d8,&local_120);
                        check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar1);
                        local_bc = ARKodeGetNumNonlinSolvConvFails
                                             (local_d8,&stack0xfffffffffffffed8);
                        check_flag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,iVar1);
                        printf("\nFinal Solver Statistics:\n");
                        printf("   Internal solver steps = %li (attempted = %li)\n",local_100,
                               local_108);
                        printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_110,local_118);
                        printf("   Total number of fixed-point iterations = %li\n",local_120);
                        printf("   Total number of nonlinear solver convergence failures = %li\n",
                               in_stack_fffffffffffffed8);
                        printf("   Total number of error test failures = %li\n\n",
                               in_stack_fffffffffffffed0);
                        N_VDestroy(local_c8);
                        ARKodeFree(&local_d8);
                        SUNNonlinSolFree(local_d0);
                        SUNLogger_Destroy(&local_b0);
                        SUNContext_Free(&local_a8);
                        local_4 = 0;
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);      /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);       /* time between outputs */
  sunindextype NEQ   = 3;                     /* number of dependent vars. */
  int Nt             = (int)ceil(Tf / dTout); /* number of output times */
  int test           = 3;                     /* test problem to run */
  sunrealtype reltol = 1.0e-6;                /* tolerances */
  sunrealtype abstol = 1.0e-10;
  int fp_m           = 3;  /* dimension of acceleration subspace */
  int maxcor         = 10; /* maximum # of nonlinear iterations/step */
  sunrealtype a, b, ep, u0, v0, w0;
  sunrealtype rdata[3];
  int monitor = 0; /* turn on/off monitoring */

  /* general problem variables */
  SUNContext ctx         = NULL;
  SUNLogger logger       = NULL;
  const char* info_fname = "ark_brusselator_fp-info.txt";
  int flag;                      /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for storing solution */
  SUNNonlinearSolver NLS = NULL; /* empty nonlinear solver object */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nst, nst_a, nfe, nfi, nni, ncfn, netf;

  /* read inputs */
  if (argc == 2) { monitor = atoi(argv[1]); }

  /* create SUNDIALS context and a logger which will record
     nonlinear solver info (e.g., residual) amongst other things. */

  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  flag = SUNLogger_Create(SUN_COMM_NULL, 0, &logger);
  if (check_flag(&flag, "SUNLogger_Create", 1)) { return 1; }

  if (monitor)
  {
    flag = SUNLogger_SetInfoFilename(logger, info_fname);
    if (check_flag(&flag, "SUNLogger_SetInfoFilename", 1)) { return 1; }
  }

  flag = SUNContext_SetLogger(ctx, logger);
  if (check_flag(&flag, "SUNContext_SetLogger", 1)) { return 1; }

  /* set up the test problem according to the desired test */
  if (test == 1)
  {
    u0 = SUN_RCONST(3.9);
    v0 = SUN_RCONST(1.1);
    w0 = SUN_RCONST(2.8);
    a  = SUN_RCONST(1.2);
    b  = SUN_RCONST(2.5);
    ep = SUN_RCONST(1.0e-5);
  }
  else if (test == 3)
  {
    u0 = SUN_RCONST(3.0);
    v0 = SUN_RCONST(3.0);
    w0 = SUN_RCONST(3.5);
    a  = SUN_RCONST(0.5);
    b  = SUN_RCONST(3.0);
    ep = SUN_RCONST(5.0e-4);
  }
  else
  {
    u0 = SUN_RCONST(1.2);
    v0 = SUN_RCONST(3.1);
    w0 = SUN_RCONST(3.0);
    a  = SUN_RCONST(1.0);
    b  = SUN_RCONST(3.5);
    ep = SUN_RCONST(5.0e-6);
  }

  /* Initial problem output */
  printf("\nBrusselator ODE test problem, fixed-point solver:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         a, b, ep);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Initialize data structures */
  rdata[0] = a; /* set user data  */
  rdata[1] = b;
  rdata[2] = ep;
  y        = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0; /* Set initial conditions */
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side functions in y'=fe(t,y)+fi(t,y),
     the initial time T0, and the initial dependent variable vector y. */
  arkode_mem = ARKStepCreate(fe, fi, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Initialize fixed-point nonlinear solver and attach to ARKODE */
  NLS = SUNNonlinSol_FixedPoint(y, fp_m, ctx);
  if (check_flag((void*)NLS, "SUNNonlinSol_FixedPoint", 0)) { return 1; }

  flag = ARKodeSetNonlinearSolver(arkode_mem, NLS);
  if (check_flag(&flag, "ARKodeSetNonlinearSolver", 1)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)rdata); /* Pass rdata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }

  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  flag = ARKodeSetMaxNonlinIters(arkode_mem,
                                 maxcor); /* Increase default iterations */
  if (check_flag(&flag, "ARKodeSetMaxNonlinIters", 1)) { return 1; }

  flag = ARKodeSetAutonomous(arkode_mem, SUNTRUE);
  if (check_flag(&flag, "ARKodeSetAutonomous", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w\n");
  printf("   ----------------------------------------------\n");
  for (iout = 0; iout < Nt; iout++)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM
           "\n", /* access/print solution */
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfe);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 1, &nfi);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total number of fixed-point iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n",
         ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* Clean up and return with successful completion */
  N_VDestroy(y);
  ARKodeFree(&arkode_mem);
  SUNNonlinSolFree(NLS);
  SUNLogger_Destroy(&logger);
  SUNContext_Free(&ctx);

  return 0;
}